

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AllSyntax.cpp
# Opt level: O3

ConstTokenOrSyntax * __thiscall
slang::syntax::ElementSelectExpressionSyntax::getChild
          (ConstTokenOrSyntax *__return_storage_ptr__,ElementSelectExpressionSyntax *this,
          size_t index)

{
  __index_type _Var1;
  ElementSelectSyntax *pEVar2;
  char *func;
  
  if (index == 1) {
    pEVar2 = (this->select).ptr;
    if (pEVar2 == (ElementSelectSyntax *)0x0) {
      func = 
      "T slang::not_null<slang::syntax::ElementSelectSyntax *>::get() const [T = slang::syntax::ElementSelectSyntax *]"
      ;
LAB_002bda60:
      assert::assertFailed
                ("ptr",
                 "/workspace/llm4binary/github/license_all_cmakelists_25/Kuree[P]hgdb-rtl/extern/slang/source/../include/slang/util/NotNull.h"
                 ,0x26,func);
    }
  }
  else {
    if (index != 0) {
      parsing::Token::Token((Token *)__return_storage_ptr__);
      _Var1 = '\0';
      goto LAB_002bda43;
    }
    pEVar2 = (ElementSelectSyntax *)(this->left).ptr;
    if (pEVar2 == (ElementSelectSyntax *)0x0) {
      func = 
      "T slang::not_null<slang::syntax::ExpressionSyntax *>::get() const [T = slang::syntax::ExpressionSyntax *]"
      ;
      goto LAB_002bda60;
    }
  }
  *(ElementSelectSyntax **)
   &(__return_storage_ptr__->super_variant<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>
    ).super__Variant_base<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
    super__Move_assign_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
    super__Copy_assign_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
    super__Move_ctor_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
    super__Copy_ctor_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
    super__Variant_storage_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*> = pEVar2;
  _Var1 = '\x01';
LAB_002bda43:
  *(__index_type *)
   ((long)&(__return_storage_ptr__->
           super_variant<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>).
           super__Variant_base<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
           super__Move_assign_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
           super__Copy_assign_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
           super__Move_ctor_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
           super__Copy_ctor_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
           super__Variant_storage_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*> +
   0x10) = _Var1;
  return __return_storage_ptr__;
}

Assistant:

ConstTokenOrSyntax ElementSelectExpressionSyntax::getChild(size_t index) const {
    switch (index) {
        case 0: return left.get();
        case 1: return select.get();
        default: return nullptr;
    }
}